

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O2

string * __thiscall Assimp::MemoryIOSystem::CurrentDirectory_abi_cxx11_(MemoryIOSystem *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_);
    if (iVar1 != 0) {
      CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_._M_dataplus._M_p =
           (pointer)&CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_.field_2;
      CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_._M_string_length = 0;
      CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_);
    }
  }
  if (this->existing_io != (IOSystem *)0x0) {
    iVar1 = (*this->existing_io->_vptr_IOSystem[8])();
    return (string *)CONCAT44(extraout_var,iVar1);
  }
  return &CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_;
}

Assistant:

const std::string &CurrentDirectory() const override {
        static std::string empty;
        return existing_io ? existing_io->CurrentDirectory() : empty;
    }